

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O0

void test_97(QPDF *pdf,char *arg2)

{
  bool bVar1;
  byte bVar2;
  __type_conflict1 _Var3;
  int iVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  undefined1 local_90 [8];
  QPDFObjectHandle nulls2;
  allocator<char> local_69;
  string local_68 [32];
  QPDFObjectHandle local_48;
  QPDFObjectHandle local_38;
  undefined1 local_28 [8];
  QPDFObjectHandle nulls;
  char *arg2_local;
  QPDF *pdf_local;
  
  nulls.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)arg2;
  QPDF::getTrailer();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_68,"/Nulls",&local_69);
  QPDFObjectHandle::getKey((string *)&local_38);
  QPDFObjectHandle::getArrayItem((int)local_28);
  QPDFObjectHandle::~QPDFObjectHandle(&local_38);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator(&local_69);
  QPDFObjectHandle::~QPDFObjectHandle(&local_48);
  bVar2 = QPDFObjectHandle::isArray();
  bVar1 = false;
  if ((bVar2 & 1) != 0) {
    iVar4 = QPDFObjectHandle::getArrayNItems();
    bVar1 = 10000 < iVar4;
  }
  if (bVar1) {
    QPDFObjectHandle::shallowCopy();
    QPDFObjectHandle::unparse_abi_cxx11_();
    QPDFObjectHandle::unparse_abi_cxx11_();
    _Var3 = std::operator==(&local_b0,&local_d0);
    if (_Var3) {
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_b0);
      QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_90);
      QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_28);
      return;
    }
    __assert_fail("nulls.unparse() == nulls2.unparse()",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0xd70,"void test_97(QPDF &, const char *)");
  }
  __assert_fail("nulls.isArray() && nulls.getArrayNItems() > 10000",
                "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc",
                0xd6e,"void test_97(QPDF &, const char *)");
}

Assistant:

static void
test_97(QPDF& pdf, char const* arg2)
{
    // Shallow array copy. This test uses many-nulls.pdf.
    auto nulls = pdf.getTrailer().getKey("/Nulls").getArrayItem(0);
    assert(nulls.isArray() && nulls.getArrayNItems() > 10000);
    auto nulls2 = nulls.shallowCopy();
    assert(nulls.unparse() == nulls2.unparse());
}